

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

void __thiscall i2p::sam::Session::CreateIfNotCreatedAlready(Session *this)

{
  Sock *pSVar1;
  pointer puVar2;
  string_view source_file;
  string_view source_file_00;
  string str;
  undefined1 auVar3 [8];
  bool bVar4;
  int iVar5;
  Logger *pLVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Level LVar7;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view str_00;
  Span<const_unsigned_char> input;
  string_view str_01;
  string_view logging_function;
  string_view logging_function_00;
  undefined8 in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  allocator<char> local_249;
  undefined1 local_248 [8];
  char *session_type;
  string local_230;
  string local_210 [32];
  Reply local_1f0;
  string log_msg;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> session_id;
  string errmsg;
  allocator<char> local_a0 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  string local_60;
  string local_40;
  long local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  errmsg._M_dataplus._M_p = (pointer)&errmsg.field_2;
  errmsg._M_string_length = 0;
  errmsg.field_2._M_local_buf[0] = '\0';
  pSVar1 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  if (pSVar1 != (Sock *)0x0) {
    iVar5 = (*pSVar1->_vptr_Sock[0x13])(pSVar1,&errmsg);
    if ((char)iVar5 != '\0') goto LAB_006d4f72;
  }
  session_type = "persistent";
  if (this->m_transient != false) {
    session_type = "transient";
  }
  GetRandHash();
  base_blob<256u>::GetHex_abi_cxx11_(&log_msg,(base_blob<256u> *)&local_40);
  pbVar8 = &log_msg;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&session_id,pbVar8,0,10);
  LVar7 = (Level)pbVar8;
  std::__cxx11::string::~string((string *)&log_msg);
  bVar4 = ::LogAcceptCategory(NET,LVar7);
  if (bVar4) {
    Proxy::ToString_abi_cxx11_(&local_100,&this->m_control_host);
    pLVar6 = LogInstance();
    bVar4 = BCLog::Logger::Enabled(pLVar6);
    if (bVar4) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<char_const*,std::__cxx11::string,std::__cxx11::string>
                (&local_40,(tinyformat *)"Creating %s SAM session %s with %s\n",
                 (char *)&session_type,(char **)&session_id,&local_100,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      pLVar6 = LogInstance();
      local_40._M_dataplus._M_p = &DAT_00000050;
      local_40._M_string_length = 0xca4174;
      in_stack_fffffffffffffd88 = 0x50;
      in_stack_fffffffffffffd90 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
      in_stack_fffffffffffffda0 = 1;
      in_stack_fffffffffffffd98 = 0x400000;
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19;
      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a1;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
      source_file._M_len = 0x50;
      str_00._M_str = log_msg._M_dataplus._M_p;
      str_00._M_len = log_msg._M_string_length;
      logging_function._M_str = "CreateIfNotCreatedAlready";
      logging_function._M_len = 0x19;
      in_R8 = "CreateIfNotCreatedAlready";
      BCLog::Logger::LogPrintStr(pLVar6,str_00,logging_function,source_file,0x1a1,I2P,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)&local_100);
  }
  Hello((Session *)local_248);
  auVar3 = local_248;
  if (this->m_transient == true) {
    tinyformat::format<std::__cxx11::string>
              (&local_40,
               (tinyformat *)
               "SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 i2cp.leaseSetEncType=4,0 inbound.quantity=1 outbound.quantity=1"
               ,(char *)&session_id,args);
    SendRequestAndGetReply((Reply *)&log_msg,this,(Sock *)auVar3,&local_40,true);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"DESTINATION",local_a0);
    Reply::Get(&local_40,(Reply *)&log_msg,&local_60);
    DecodeI2PBase64((Binary *)&local_80,&local_40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&this->m_private_key,&local_80);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    Reply::~Reply((Reply *)&log_msg);
  }
  else {
    ReadBinaryFile_abi_cxx11_
              ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&log_msg,&this->m_private_key_file,0xffffffffffffffff);
    if ((char)log_msg._M_dataplus._M_p == '\x01') {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_private_key,
                 log_msg._M_string_length,
                 CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                          log_msg.field_2._M_local_buf[0]) + log_msg._M_string_length);
    }
    else {
      GenerateAndSavePrivateKey(this,(Sock *)local_248);
    }
    puVar2 = (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    input.m_size = (long)(this->m_private_key).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar2;
    input.m_data = puVar2;
    EncodeBase64_abi_cxx11_(&local_60,input);
    SwapBase64(&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    auVar3 = local_248;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_60,
               (tinyformat *)
               "SESSION CREATE STYLE=STREAM ID=%s DESTINATION=%s i2cp.leaseSetEncType=4,0 inbound.quantity=3 outbound.quantity=3"
               ,(char *)&session_id,&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8);
    SendRequestAndGetReply(&local_1f0,this,(Sock *)auVar3,&local_60,true);
    Reply::~Reply(&local_1f0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&log_msg._M_string_length);
  }
  MyDestination((Binary *)&local_60,this);
  DestBinToAddr((CNetAddr *)&local_40,(Binary *)&local_60);
  CService::CService((CService *)&log_msg,(CNetAddr *)&local_40,0);
  CService::operator=(&this->m_my_addr,(CService *)&log_msg);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&log_msg);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
  pbVar8 = &session_id;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->m_session_id,pbVar8);
  auVar3 = local_248;
  LVar7 = (Level)pbVar8;
  local_248 = (undefined1  [8])0x0;
  pSVar1 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (Sock *)auVar3;
  if (pSVar1 != (Sock *)0x0) {
    (*pSVar1->_vptr_Sock[1])();
  }
  bVar4 = ::LogAcceptCategory(TOR,LVar7);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>(local_210,session_type,&local_249);
    str._M_string_length = (size_type)in_stack_fffffffffffffd90;
    str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
    str.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
    str.field_2._8_4_ = in_stack_fffffffffffffda0;
    str.field_2._12_4_ = in_stack_fffffffffffffda4;
    Capitalize(&local_100,str);
    CService::ToStringAddrPort_abi_cxx11_(&local_230,&this->m_my_addr);
    pLVar6 = LogInstance();
    bVar4 = BCLog::Logger::Enabled(pLVar6);
    if (bVar4) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (&local_40,(tinyformat *)"%s SAM session %s created, my address=%s\n",
                 (char *)&local_100,&this->m_session_id,&local_230,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      pLVar6 = LogInstance();
      local_40._M_dataplus._M_p = &DAT_00000050;
      local_40._M_string_length = 0xca4174;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
      source_file_00._M_len = 0x50;
      str_01._M_str = log_msg._M_dataplus._M_p;
      str_01._M_len = log_msg._M_string_length;
      logging_function_00._M_str = "CreateIfNotCreatedAlready";
      logging_function_00._M_len = 0x19;
      BCLog::Logger::LogPrintStr(pLVar6,str_01,logging_function_00,source_file_00,0x1c9,I2P,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string(local_210);
  }
  if (local_248 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_248 + 8))();
  }
  std::__cxx11::string::~string((string *)&session_id);
LAB_006d4f72:
  std::__cxx11::string::~string((string *)&errmsg);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Session::CreateIfNotCreatedAlready()
{
    std::string errmsg;
    if (m_control_sock && m_control_sock->IsConnected(errmsg)) {
        return;
    }

    const auto session_type = m_transient ? "transient" : "persistent";
    const auto session_id = GetRandHash().GetHex().substr(0, 10); // full is overkill, too verbose in the logs

    LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Creating %s SAM session %s with %s\n", session_type, session_id, m_control_host.ToString());

    auto sock = Hello();

    if (m_transient) {
        // The destination (private key) is generated upon session creation and returned
        // in the reply in DESTINATION=.
        const Reply& reply = SendRequestAndGetReply(
            *sock,
            strprintf("SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 "
                      "i2cp.leaseSetEncType=4,0 inbound.quantity=1 outbound.quantity=1",
                      session_id));

        m_private_key = DecodeI2PBase64(reply.Get("DESTINATION"));
    } else {
        // Read our persistent destination (private key) from disk or generate
        // one and save it to disk. Then use it when creating the session.
        const auto& [read_ok, data] = ReadBinaryFile(m_private_key_file);
        if (read_ok) {
            m_private_key.assign(data.begin(), data.end());
        } else {
            GenerateAndSavePrivateKey(*sock);
        }

        const std::string& private_key_b64 = SwapBase64(EncodeBase64(m_private_key));

        SendRequestAndGetReply(*sock,
                               strprintf("SESSION CREATE STYLE=STREAM ID=%s DESTINATION=%s "
                                         "i2cp.leaseSetEncType=4,0 inbound.quantity=3 outbound.quantity=3",
                                         session_id,
                                         private_key_b64));
    }

    m_my_addr = CService(DestBinToAddr(MyDestination()), I2P_SAM31_PORT);
    m_session_id = session_id;
    m_control_sock = std::move(sock);

    LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "%s SAM session %s created, my address=%s\n",
        Capitalize(session_type),
        m_session_id,
        m_my_addr.ToStringAddrPort());
}